

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str_hash.c
# Opt level: O2

StrHash hash_dense_sse42(uint64_t seed,uint32_t h,char *str,MSize len)

{
  uint32_t uVar1;
  StrHash SVar2;
  ulong uVar3;
  undefined8 uVar4;
  long lVar5;
  undefined8 uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  
  uVar7 = (uint)(seed >> 0x20) ^ h;
  uVar8 = uVar7 << 4;
  uVar8 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
          (uVar8 | uVar7 >> 0x1c) << 0x18;
  if (len < 0x11) {
    return uVar8;
  }
  if (0x7f < len) {
    uVar1 = hash_128_above((ulong)uVar8,str,len);
    return uVar1;
  }
  uVar9 = 0;
  uVar8 = crc32(0,uVar8 ^ len);
  uVar3 = (ulong)uVar8;
  lVar5 = 0;
  for (; uVar9 < len - 0x10; uVar9 = uVar9 + 0x10) {
    lVar10 = crc32(uVar3,*(undefined8 *)(str + uVar9));
    uVar3 = uVar3 + lVar10;
    lVar10 = crc32(lVar5,*(undefined8 *)(str + uVar9 + 8));
    lVar5 = lVar5 + lVar10;
  }
  uVar4 = crc32(uVar3,*(undefined8 *)(str + ((ulong)len - 0x10)));
  uVar6 = crc32(lVar5,*(undefined8 *)(str + ((ulong)len - 8)));
  SVar2 = crc32((int)uVar4,(int)uVar6);
  return SVar2;
}

Assistant:

static StrHash hash_dense_sse42(uint64_t seed, uint32_t h, const char* str,
				MSize len)
{
  uint32_t b = lj_bswap(lj_rol(h ^ (uint32_t)(seed >> 32), 4));

  if (len <= 16)
    return b;

  if (len < 128) /* [16, 128), try with a different seed. */
    return hash_16_128(b, str, len);

  /* Otherwise, do the slow crc32 randomization for long strings. */
  return hash_128_above(b, str, len);
}